

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http2.c
# Opt level: O3

int h2_process_pending_input(Curl_easy *data,http_conn *httpc,CURLcode *err)

{
  int iVar1;
  size_t sVar2;
  char *pcVar3;
  CURLcode CVar4;
  size_t inlen;
  
  inlen = httpc->inbuflen - httpc->nread_inbuf;
  httpc->trnsfr = data;
  sVar2 = nghttp2_session_mem_recv(httpc->h2,(uint8_t *)(httpc->inbuf + httpc->nread_inbuf),inlen);
  if ((long)sVar2 < 0) {
    pcVar3 = nghttp2_strerror((int)sVar2);
    Curl_failf(data,"h2_process_pending_input: nghttp2_session_mem_recv() returned %zd:%s",sVar2,
               pcVar3);
    CVar4 = CURLE_RECV_ERROR;
  }
  else {
    if (inlen == sVar2) {
      httpc->inbuflen = 0;
      sVar2 = 0;
    }
    else {
      sVar2 = httpc->nread_inbuf + sVar2;
    }
    httpc->nread_inbuf = sVar2;
    iVar1 = h2_session_send(data,httpc->h2);
    CVar4 = CURLE_SEND_ERROR;
    if (iVar1 == 0) {
      iVar1 = nghttp2_session_check_request_allowed(httpc->h2);
      if (iVar1 == 0) {
        Curl_conncontrol(data->conn,1);
      }
      iVar1 = should_close_session(httpc);
      if (iVar1 == 0) {
        return 0;
      }
      CVar4 = CURLE_HTTP2;
      if (((data->req).p.http)->error == 0) {
        Curl_conncontrol(data->conn,1);
        CVar4 = CURLE_OK;
      }
    }
  }
  *err = CVar4;
  return -1;
}

Assistant:

static int h2_process_pending_input(struct Curl_easy *data,
                                    struct http_conn *httpc,
                                    CURLcode *err)
{
  ssize_t nread;
  char *inbuf;
  ssize_t rv;

  nread = httpc->inbuflen - httpc->nread_inbuf;
  inbuf = httpc->inbuf + httpc->nread_inbuf;

  set_transfer(httpc, data); /* set the transfer */
  rv = nghttp2_session_mem_recv(httpc->h2, (const uint8_t *)inbuf, nread);
  if(rv < 0) {
    failf(data,
          "h2_process_pending_input: nghttp2_session_mem_recv() returned "
          "%zd:%s", rv, nghttp2_strerror((int)rv));
    *err = CURLE_RECV_ERROR;
    return -1;
  }

  if(nread == rv) {
    H2BUGF(infof(data,
                 "h2_process_pending_input: All data in connection buffer "
                 "processed"));
    httpc->inbuflen = 0;
    httpc->nread_inbuf = 0;
  }
  else {
    httpc->nread_inbuf += rv;
    H2BUGF(infof(data,
                 "h2_process_pending_input: %zu bytes left in connection "
                 "buffer",
                 httpc->inbuflen - httpc->nread_inbuf));
  }

  rv = h2_session_send(data, httpc->h2);
  if(rv) {
    *err = CURLE_SEND_ERROR;
    return -1;
  }

  if(nghttp2_session_check_request_allowed(httpc->h2) == 0) {
    /* No more requests are allowed in the current session, so
       the connection may not be reused. This is set when a
       GOAWAY frame has been received or when the limit of stream
       identifiers has been reached. */
    connclose(data->conn, "http/2: No new requests allowed");
  }

  if(should_close_session(httpc)) {
    struct HTTP *stream = data->req.p.http;
    H2BUGF(infof(data,
                 "h2_process_pending_input: nothing to do in this session"));
    if(stream->error)
      *err = CURLE_HTTP2;
    else {
      /* not an error per se, but should still close the connection */
      connclose(data->conn, "GOAWAY received");
      *err = CURLE_OK;
    }
    return -1;
  }
  return 0;
}